

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RayTracerTriangles.cpp
# Opt level: O0

void __thiscall RayTracerTriangles::processPixels(RayTracerTriangles *this)

{
  int local_60;
  int i_1;
  RayTracerTriangles *local_50;
  code *local_48;
  undefined8 local_40;
  thread local_38;
  int local_2c;
  undefined1 local_28 [4];
  int i;
  vector<std::thread,_std::allocator<std::thread>_> thVec;
  RayTracerTriangles *this_local;
  
  thVec.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)this;
  std::vector<std::thread,_std::allocator<std::thread>_>::vector
            ((vector<std::thread,_std::allocator<std::thread>_> *)local_28);
  for (local_2c = 0; local_2c < this->threadNumber + -1; local_2c = local_2c + 1) {
    local_48 = processPixelsThreads;
    local_40 = 0;
    local_50 = this;
    std::thread::thread<void(RayTracerTriangles::*)(int),RayTracerTriangles*,int&,void>
              (&local_38,(type *)&local_48,&local_50,&local_2c);
    std::vector<std::thread,_std::allocator<std::thread>_>::push_back
              ((vector<std::thread,_std::allocator<std::thread>_> *)local_28,&local_38);
    std::thread::~thread(&local_38);
  }
  processPixelsThreads(this,this->threadNumber + -1);
  for (local_60 = 0; local_60 < this->threadNumber + -1; local_60 = local_60 + 1) {
    std::vector<std::thread,_std::allocator<std::thread>_>::operator[]
              ((vector<std::thread,_std::allocator<std::thread>_> *)local_28,(long)local_60);
    std::thread::join();
  }
  std::vector<std::thread,_std::allocator<std::thread>_>::~vector
            ((vector<std::thread,_std::allocator<std::thread>_> *)local_28);
  return;
}

Assistant:

void RayTracerTriangles::processPixels()
{
  std::vector<std::thread> thVec;
  for (int i = 0; i < threadNumber - 1; i++)
    thVec.push_back(std::thread(&RayTracerTriangles::processPixelsThreads, this, i));

  processPixelsThreads(threadNumber - 1);

  for (int i = 0; i < threadNumber - 1; i++)
    thVec[i].join();
}